

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

_Bool ascon_hasha_matches(uint8_t *expected_digest,uint8_t *data,size_t data_len)

{
  _Bool _Var1;
  ascon_hash_ctx_t ctx;
  uint8_t *in_stack_ffffffffffffffa8;
  ascon_hash_ctx_t *in_stack_ffffffffffffffb0;
  
  ascon_hasha_init((ascon_hash_ctx_t *)0x10528b);
  ascon_hasha_xof_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x10529d);
  _Var1 = ascon_hasha_xof_final_matches
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1052af);
  return _Var1;
}

Assistant:

ASCON_API bool
ascon_hasha_matches(const uint8_t expected_digest[ASCON_HASHA_DIGEST_LEN],
                    const uint8_t* const data,
                    const size_t data_len)
{
    ASCON_ASSERT(expected_digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    return ascon_hasha_xof_final_matches(&ctx, expected_digest, ASCON_HASHA_DIGEST_LEN);
}